

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  pointer args;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->IgnoredPaths,dir);
  if (sVar3 == 0) {
    pbVar1 = (this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (args = (this->Configs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; args != pbVar1; args = args + 1) {
      local_80.View_._M_str = (dir->_M_dataplus)._M_p;
      local_80.View_._M_len = dir->_M_string_length;
      local_b0.View_._M_len = 1;
      local_b0.View_._M_str = local_b0.Digits_;
      local_b0.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_50,&local_80,&local_b0,args);
      std::__cxx11::string::operator=((string *)file,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if ((this->super_cmFindCommon).DebugMode == true) {
        local_80.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
        local_80.View_._M_len = (this->DebugBuffer)._M_string_length;
        local_b0.View_._M_len = 2;
        local_b0.View_._M_str = "  ";
        cmStrCat<std::__cxx11::string,char[2]>
                  (&local_50,&local_80,&local_b0,file,(char (*) [2])0x647ff5);
        std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      bVar2 = cmsys::SystemTools::FileExists(file,true);
      if ((bVar2) && (bVar2 = CheckVersion(this,file), bVar2)) {
        if (this->UseRealPath != true) {
          return true;
        }
        cmsys::SystemTools::GetRealPath((string *)&local_80,file,(string *)0x0);
        std::__cxx11::string::operator=((string *)file,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir)) {
    return false;
  }

  for (std::string const& c : this->Configs) {
    file = cmStrCat(dir, '/', c);
    if (this->DebugMode) {
      this->DebugBuffer = cmStrCat(this->DebugBuffer, "  ", file, "\n");
    }
    if (cmSystemTools::FileExists(file, true) && this->CheckVersion(file)) {
      // Allow resolving symlinks when the config file is found through a link
      if (this->UseRealPath) {
        file = cmSystemTools::GetRealPath(file);
      }
      return true;
    }
  }
  return false;
}